

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

float __thiscall nv::FloatImage::sampleLinearMirror(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint w;
  int iVar8;
  float __x;
  float fVar9;
  float fVar10;
  float __x_00;
  
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  __x_00 = (float)uVar1 * x;
  __x = (float)uVar2 * y;
  fVar9 = floorf(__x_00);
  fVar9 = __x_00 - fVar9;
  fVar10 = floorf(__x);
  iVar4 = anon_unknown.dwarf_4c3dee::mirror((int)__x_00,(uint)uVar1);
  iVar5 = anon_unknown.dwarf_4c3dee::mirror((int)__x,(uint)uVar2);
  w = (uint)uVar1;
  iVar6 = anon_unknown.dwarf_4c3dee::mirror((int)__x_00 + 1,w);
  iVar7 = anon_unknown.dwarf_4c3dee::mirror((int)__x + 1,(uint)uVar2);
  pfVar3 = this->m_mem;
  iVar8 = (iVar5 + c * (uint)uVar2) * w;
  iVar5 = (c * (uint)uVar2 + iVar7) * w;
  return ((1.0 - fVar9) * pfVar3[(uint)(iVar4 + iVar5)] + fVar9 * pfVar3[(uint)(iVar5 + iVar6)]) *
         (__x - fVar10) +
         (1.0 - (__x - fVar10)) *
         (pfVar3[(uint)(iVar4 + iVar8)] * (1.0 - fVar9) + pfVar3[(uint)(iVar8 + iVar6)] * fVar9);
}

Assistant:

float FloatImage::sampleLinearMirror(float x, float y, int c) const
{
	const int w = m_width;
	const int h = m_height;

	x *= w;
	y *= h;

	const float fracX = frac(x);
	const float fracY = frac(y);

	int ix0 = mirror(iround(x), w);
	int iy0 = mirror(iround(y), h);
	int ix1 = mirror(iround(x) + 1, w);
	int iy1 = mirror(iround(y) + 1, h);

	float f1 = pixel(ix0, iy0, c);
	float f2 = pixel(ix1, iy0, c);
	float f3 = pixel(ix0, iy1, c);
	float f4 = pixel(ix1, iy1, c);
	
	float i1 = lerp(f1, f2, fracX);
	float i2 = lerp(f3, f4, fracX);

	return lerp(i1, i2, fracY);
}